

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trianglemesh.hpp
# Opt level: O3

vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_> * __thiscall
TriangleMesh::loadfromfile
          (vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_> *__return_storage_ptr__,
          TriangleMesh *this,char *filename)

{
  pointer *pppBVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  iterator __position;
  undefined8 uVar7;
  undefined1 auVar8 [16];
  pointer pvVar9;
  char *pcVar10;
  char cVar11;
  int iVar12;
  uint uVar13;
  size_t sVar14;
  istream *piVar15;
  Triangle *this_00;
  long lVar16;
  undefined8 *puVar17;
  vec3f *__args;
  int iVar18;
  bool bVar19;
  int iVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  vector<vec3f,_std::allocator<vec3f>_> vv;
  vec2f local_4f8;
  float local_4f0;
  int indices [3];
  vector<vec2f,_std::allocator<vec2f>_> vt;
  vector<vec3f,_std::allocator<vec3f>_> vn;
  vector<vec3f,_std::allocator<vec3f>_> v;
  vector<vec2f,_std::allocator<vec2f>_> vvt;
  vector<vec3f,_std::allocator<vec3f>_> vvn;
  string cmd;
  string line;
  char *filename_local;
  stringstream in;
  byte abStack_3a0 [96];
  ios_base local_340 [264];
  ifstream fin;
  byte abStack_218 [488];
  
  filename_local = filename;
  github111116::ConsoleLogger::log<char[14],char_const*>
            (&console,(char (*) [14])"Loading mesh:",&filename_local);
  pcVar10 = filename_local;
  sVar14 = strlen(filename_local);
  iVar12 = strcmp(pcVar10 + (sVar14 - 4),".obj");
  if (iVar12 != 0) {
    puVar17 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar17 = "format must be obj";
    __cxa_throw(puVar17,&char_const*::typeinfo,0);
  }
  std::ifstream::ifstream(&fin,pcVar10,_S_in);
  if ((abStack_218[*(long *)(_fin + -0x18)] & 5) != 0) {
    puVar17 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar17 = "Can\'t open file";
    __cxa_throw(puVar17,&char_const*::typeinfo,0);
  }
  (__return_storage_ptr__->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  v.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  v.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  v.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  vn.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  vn.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  vn.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  vt.super__Vector_base<vec2f,_std::allocator<vec2f>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  vt.super__Vector_base<vec2f,_std::allocator<vec2f>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  vt.super__Vector_base<vec2f,_std::allocator<vec2f>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  do {
    do {
      cVar11 = std::ios::widen((char)*(undefined8 *)(_fin + -0x18) + (char)(istream *)&fin);
      piVar15 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                          ((istream *)&fin,(string *)&line,cVar11);
      if (((byte)piVar15[*(long *)(*(long *)piVar15 + -0x18) + 0x20] & 5) != 0) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)line._M_dataplus._M_p != &line.field_2) {
          operator_delete(line._M_dataplus._M_p,
                          CONCAT71(line.field_2._M_allocated_capacity._1_7_,
                                   line.field_2._M_local_buf[0]) + 1);
        }
        if (vt.super__Vector_base<vec2f,_std::allocator<vec2f>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0) {
          operator_delete(vt.super__Vector_base<vec2f,_std::allocator<vec2f>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)vt.super__Vector_base<vec2f,_std::allocator<vec2f>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)vt.super__Vector_base<vec2f,_std::allocator<vec2f>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (vn.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0) {
          operator_delete(vn.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)vn.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)vn.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (v.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0) {
          operator_delete(v.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)v.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)v.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        std::ifstream::~ifstream(&fin);
        return __return_storage_ptr__;
      }
      iVar12 = isalpha((int)*line._M_dataplus._M_p);
    } while (iVar12 == 0);
    std::__cxx11::stringstream::stringstream((stringstream *)&in,(string *)&line,_S_out|_S_in);
    cmd._M_dataplus._M_p = (pointer)&cmd.field_2;
    cmd._M_string_length = 0;
    cmd.field_2._M_local_buf[0] = '\0';
    std::operator>>((istream *)&in,(string *)&cmd);
    iVar12 = std::__cxx11::string::compare((char *)&cmd);
    if (iVar12 == 0) {
      vv.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data._M_start
           = (pointer)0x0;
      vv.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data._M_finish
           = (pointer)((ulong)vv.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.
                              super__Vector_impl_data._M_finish & 0xffffffff00000000);
      operator>>((istream *)&in,(vec3f *)&vv);
      if (v.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          v.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<vec3f,std::allocator<vec3f>>::_M_realloc_insert<vec3f_const&>
                  ((vector<vec3f,std::allocator<vec3f>> *)&v,
                   (iterator)
                   v.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.
                   super__Vector_impl_data._M_finish,(vec3f *)&vv);
      }
      else {
        (v.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data.
        _M_finish)->z =
             vv.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data.
             _M_finish._0_4_;
        *(pointer *)
         v.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data.
         _M_finish = vv.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.
                     super__Vector_impl_data._M_start;
        v.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data.
        _M_finish = v.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
    }
    iVar12 = std::__cxx11::string::compare((char *)&cmd);
    if (iVar12 == 0) {
      vv.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data._M_start
           = (pointer)0x0;
      operator>>((istream *)&in,(vec2f *)&vv);
      if (vt.super__Vector_base<vec2f,_std::allocator<vec2f>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          vt.super__Vector_base<vec2f,_std::allocator<vec2f>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<vec2f,std::allocator<vec2f>>::_M_realloc_insert<vec2f_const&>
                  ((vector<vec2f,std::allocator<vec2f>> *)&vt,
                   (iterator)
                   vt.super__Vector_base<vec2f,_std::allocator<vec2f>_>._M_impl.
                   super__Vector_impl_data._M_finish,(vec2f *)&vv);
      }
      else {
        *vt.super__Vector_base<vec2f,_std::allocator<vec2f>_>._M_impl.super__Vector_impl_data.
         _M_finish = (vec2f)vv.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.
                            super__Vector_impl_data._M_start;
        vt.super__Vector_base<vec2f,_std::allocator<vec2f>_>._M_impl.super__Vector_impl_data.
        _M_finish = vt.super__Vector_base<vec2f,_std::allocator<vec2f>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
    }
    iVar12 = std::__cxx11::string::compare((char *)&cmd);
    if (iVar12 == 0) {
      vv.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data._M_start
           = (pointer)0x0;
      vv.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data._M_finish
           = (pointer)((ulong)vv.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.
                              super__Vector_impl_data._M_finish & 0xffffffff00000000);
      operator>>((istream *)&in,(vec3f *)&vv);
      if (vn.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          vn.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<vec3f,std::allocator<vec3f>>::_M_realloc_insert<vec3f_const&>
                  ((vector<vec3f,std::allocator<vec3f>> *)&vn,
                   (iterator)
                   vn.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.
                   super__Vector_impl_data._M_finish,(vec3f *)&vv);
      }
      else {
        (vn.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data.
        _M_finish)->z =
             vv.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data.
             _M_finish._0_4_;
        *(pointer *)
         vn.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data.
         _M_finish = vv.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.
                     super__Vector_impl_data._M_start;
        vn.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data.
        _M_finish = vn.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
    }
    iVar12 = std::__cxx11::string::compare((char *)&cmd);
    if (iVar12 == 0) {
      vv.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data._M_start
           = (pointer)0x0;
      vv.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data._M_finish
           = (pointer)0x0;
      vv.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      vvn.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      vvn.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data._M_start
           = (pointer)0x0;
      vvn.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      vvt.super__Vector_base<vec2f,_std::allocator<vec2f>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      vvt.super__Vector_base<vec2f,_std::allocator<vec2f>_>._M_impl.super__Vector_impl_data._M_start
           = (pointer)0x0;
      vvt.super__Vector_base<vec2f,_std::allocator<vec2f>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      if ((abStack_3a0[*(long *)(_in + -0x18)] & 7) == 0) {
        bVar19 = false;
        do {
          indices[2] = 0;
          indices[0] = 0;
          indices[1] = 0;
          lVar16 = 0;
          do {
            iVar12 = std::istream::peek();
            if (iVar12 != 0x2f) {
              std::istream::operator>>((istream *)&in,(int *)((long)indices + lVar16));
            }
            iVar12 = std::istream::peek();
            if (iVar12 != 0x2f) break;
            std::istream::get();
            lVar16 = lVar16 + 4;
          } while (lVar16 != 0xc);
          while( true ) {
            iVar12 = std::istream::peek();
            iVar12 = isspace(iVar12);
            if (iVar12 == 0) break;
            std::istream::get();
          }
          if (indices[0] == 0) {
            github111116::ConsoleLogger::log<char[10],std::__cxx11::string>
                      (&console,(char (*) [10])"Obj line:",&line);
            puVar17 = (undefined8 *)__cxa_allocate_exception(8);
            *puVar17 = "error parsing obj";
            __cxa_throw(puVar17,&char_const*::typeinfo,0);
          }
          iVar12 = indices[0];
          if (indices[0] < 0) {
            iVar12 = indices[0] +
                     (int)((ulong)((long)v.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl
                                         .super__Vector_impl_data._M_finish -
                                  (long)v.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.
                                        super__Vector_impl_data._M_start) >> 2) * -0x55555555 + 1;
          }
          iVar20 = indices[1];
          if ((long)indices._0_8_ < 0) {
            iVar20 = indices[1] +
                     (int)((ulong)((long)vt.super__Vector_base<vec2f,_std::allocator<vec2f>_>.
                                         _M_impl.super__Vector_impl_data._M_finish -
                                  (long)vt.super__Vector_base<vec2f,_std::allocator<vec2f>_>._M_impl
                                        .super__Vector_impl_data._M_start) >> 3) + 1;
          }
          iVar18 = indices[2];
          if (indices[2] < 0) {
            iVar18 = indices[2] +
                     (int)((ulong)((long)vn.super__Vector_base<vec3f,_std::allocator<vec3f>_>.
                                         _M_impl.super__Vector_impl_data._M_finish -
                                  (long)vn.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl
                                        .super__Vector_impl_data._M_start) >> 2) * -0x55555555 + 1;
          }
          __args = v.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.
                   super__Vector_impl_data._M_start + (long)iVar12 + -1;
          if (vv.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data.
              _M_finish ==
              vv.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage) {
            std::vector<vec3f,std::allocator<vec3f>>::_M_realloc_insert<vec3f_const&>
                      ((vector<vec3f,std::allocator<vec3f>> *)&vv,
                       (iterator)
                       vv.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.
                       super__Vector_impl_data._M_finish,__args);
          }
          else {
            (vv.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data.
            _M_finish)->z =
                 v.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data
                 ._M_start[(long)iVar12 + -1].z;
            fVar21 = __args->y;
            (vv.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data.
            _M_finish)->x = __args->x;
            (vv.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data.
            _M_finish)->y = fVar21;
            vv.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data.
            _M_finish = vv.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.
                        super__Vector_impl_data._M_finish + 1;
          }
          if (iVar20 == 0) {
            local_4f8.x = 0.0;
            local_4f8.y = 0.0;
          }
          else {
            local_4f8 = vt.super__Vector_base<vec2f,_std::allocator<vec2f>_>._M_impl.
                        super__Vector_impl_data._M_start[(long)iVar20 + -1];
          }
          if (vvt.super__Vector_base<vec2f,_std::allocator<vec2f>_>._M_impl.super__Vector_impl_data.
              _M_finish ==
              vvt.super__Vector_base<vec2f,_std::allocator<vec2f>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage) {
            std::vector<vec2f,_std::allocator<vec2f>_>::_M_realloc_insert<vec2f>
                      (&vvt,(iterator)
                            vvt.super__Vector_base<vec2f,_std::allocator<vec2f>_>._M_impl.
                            super__Vector_impl_data._M_finish,&local_4f8);
          }
          else {
            *vvt.super__Vector_base<vec2f,_std::allocator<vec2f>_>._M_impl.super__Vector_impl_data.
             _M_finish = local_4f8;
            vvt.super__Vector_base<vec2f,_std::allocator<vec2f>_>._M_impl.super__Vector_impl_data.
            _M_finish = vvt.super__Vector_base<vec2f,_std::allocator<vec2f>_>._M_impl.
                        super__Vector_impl_data._M_finish + 1;
          }
          if (iVar18 == 0) {
            local_4f8.x = 0.0;
            local_4f8.y = 1.0;
            local_4f0 = 0.0;
          }
          else {
            local_4f8.x = vn.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.
                          super__Vector_impl_data._M_start[(long)iVar18 + -1].x;
            local_4f8.y = vn.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.
                          super__Vector_impl_data._M_start[(long)iVar18 + -1].y;
            local_4f0 = vn.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.
                        super__Vector_impl_data._M_start[(long)iVar18 + -1].z;
          }
          if (vvn.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data.
              _M_finish ==
              vvn.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage) {
            std::vector<vec3f,_std::allocator<vec3f>_>::_M_realloc_insert<vec3f>
                      (&vvn,(iterator)
                            vvn.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.
                            super__Vector_impl_data._M_finish,(vec3f *)&local_4f8);
          }
          else {
            (vvn.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data.
            _M_finish)->z = local_4f0;
            (vvn.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data.
            _M_finish)->x = local_4f8.x;
            (vvn.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data.
            _M_finish)->y = local_4f8.y;
            vvn.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data.
            _M_finish = vvn.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.
                        super__Vector_impl_data._M_finish + 1;
          }
          bVar19 = (bool)(bVar19 | iVar18 == 0);
        } while ((abStack_3a0[*(long *)(_in + -0x18)] & 7) == 0);
      }
      else {
        bVar19 = false;
      }
      pvVar9 = vv.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data.
               _M_start;
      if ((long)vv.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data
                ._M_finish -
          (long)vv.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data
                ._M_start != 0x24) {
        puVar17 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar17 = "mesh face other than triangle not supported";
        __cxa_throw(puVar17,&char_const*::typeinfo,0);
      }
      fVar21 = vv.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data.
               _M_start[1].x -
               (vv.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data
               ._M_start)->x;
      uVar2 = vv.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data.
              _M_start[1].y;
      uVar4 = vv.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data.
              _M_start[1].z;
      uVar3 = (vv.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data.
              _M_start)->y;
      uVar5 = (vv.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data.
              _M_start)->z;
      fVar22 = vv.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data.
               _M_start[2].y - (float)uVar3;
      fVar23 = vv.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data.
               _M_start[2].z - (float)uVar5;
      fVar24 = vv.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data.
               _M_start[2].x -
               (vv.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data
               ._M_start)->x;
      iVar12 = -(uint)(((float)uVar2 - (float)uVar3) * fVar23 -
                       fVar22 * ((float)uVar4 - (float)uVar5) != 0.0);
      iVar20 = -(uint)(((float)uVar4 - (float)uVar5) * fVar24 - fVar23 * fVar21 != 0.0);
      auVar8._4_4_ = iVar12;
      auVar8._0_4_ = iVar12;
      auVar8._8_4_ = iVar20;
      auVar8._12_4_ = iVar20;
      uVar13 = movmskpd(0x24,auVar8);
      if (((((uVar13 & 1) != 0) || ((byte)((byte)uVar13 >> 1) != 0)) ||
          (fVar21 = fVar21 * fVar22 - fVar24 * ((float)uVar2 - (float)uVar3), fVar21 != 0.0)) ||
         (NAN(fVar21))) {
        this_00 = (Triangle *)operator_new(0xa0);
        Triangle::Triangle(this_00,*pvVar9,pvVar9[1],pvVar9[2],
                           *vvt.super__Vector_base<vec2f,_std::allocator<vec2f>_>._M_impl.
                            super__Vector_impl_data._M_start,
                           vvt.super__Vector_base<vec2f,_std::allocator<vec2f>_>._M_impl.
                           super__Vector_impl_data._M_start[1],
                           vvt.super__Vector_base<vec2f,_std::allocator<vec2f>_>._M_impl.
                           super__Vector_impl_data._M_start[2],
                           *vvn.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.
                            super__Vector_impl_data._M_start,
                           vvn.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.
                           super__Vector_impl_data._M_start[1],
                           vvn.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.
                           super__Vector_impl_data._M_start[2]);
        __position._M_current =
             (__return_storage_ptr__->
             super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        indices._0_8_ = this_00;
        if (__position._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<BasicPrimitive*,std::allocator<BasicPrimitive*>>::
          _M_realloc_insert<BasicPrimitive*>
                    ((vector<BasicPrimitive*,std::allocator<BasicPrimitive*>> *)
                     __return_storage_ptr__,__position,(BasicPrimitive **)indices);
        }
        else {
          *__position._M_current = (BasicPrimitive *)this_00;
          pppBVar1 = &(__return_storage_ptr__->
                      super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>).
                      _M_impl.super__Vector_impl_data._M_finish;
          *pppBVar1 = *pppBVar1 + 1;
        }
        if (bVar19) {
          lVar16 = __dynamic_cast((__return_storage_ptr__->
                                  super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>
                                  )._M_impl.super__Vector_impl_data._M_finish[-1],
                                  &BasicPrimitive::typeinfo,&Triangle::typeinfo,0);
          uVar7 = *(undefined8 *)(lVar16 + 0x8c);
          *(undefined8 *)(lVar16 + 0x44) = uVar7;
          uVar6 = *(undefined4 *)(lVar16 + 0x94);
          *(undefined4 *)(lVar16 + 0x4c) = uVar6;
          *(undefined8 *)(lVar16 + 0x38) = uVar7;
          *(undefined4 *)(lVar16 + 0x40) = uVar6;
          *(undefined8 *)(lVar16 + 0x2c) = uVar7;
          *(undefined4 *)(lVar16 + 0x34) = uVar6;
        }
      }
      if (vvt.super__Vector_base<vec2f,_std::allocator<vec2f>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(vvt.super__Vector_base<vec2f,_std::allocator<vec2f>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)vvt.super__Vector_base<vec2f,_std::allocator<vec2f>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)vvt.super__Vector_base<vec2f,_std::allocator<vec2f>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (vvn.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(vvn.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)vvn.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)vvn.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (vv.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(vv.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)vv.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)vv.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)cmd._M_dataplus._M_p != &cmd.field_2) {
      operator_delete(cmd._M_dataplus._M_p,
                      CONCAT71(cmd.field_2._M_allocated_capacity._1_7_,cmd.field_2._M_local_buf[0])
                      + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&in);
    std::ios_base::~ios_base(local_340);
  } while( true );
}

Assistant:

std::vector<BasicPrimitive*> loadfromfile(const char* filename)
	{
		console.log("Loading mesh:", filename);
		if (strcmp(filename+strlen(filename)-4, ".obj") != 0)
			throw "format must be obj";
		std::ifstream fin(filename);
		if (!fin)
			throw "Can't open file";
		std::vector<BasicPrimitive*> faces;
		std::vector<vec3f> v,vn;
		std::vector<vec2f> vt;
		std::string line;
		// reading file line by line
		while (std::getline(fin, line)) {
			if (isalpha(line[0])) {
				std::stringstream in(line);
				std::string cmd;
				in >> cmd;
				if (cmd == "v") { // vertex coordinate
					vec3f t;
					in >> t;
					v.push_back(t);
				}
				if (cmd == "vt") { // texture coordinate
					vec2f t;
					in >> t;
					vt.push_back(t);
				}
				if (cmd == "vn") { // normal vector
					vec3f t;
					in >> t;
					vn.push_back(t);
				}
				if (cmd == "f") { // polygon face
					std::vector<vec3f> vv, vvn;
					std::vector<vec2f> vvt;
					bool recompute_normal = false;
					while (!in.fail() && !in.eof()) {					
						// code from tungsten ObjLoader::loadFace
						int indices[] = {0, 0, 0};
						for (int i = 0; i < 3; ++i) {
							if (in.peek() != '/')
								in >> indices[i];
							if (in.peek() == '/')
								in.get();
							else
								break;
						}
						while (isspace(in.peek()))
							in.get();
						if (!indices[0]) {
							console.log("Obj line:", line);
							throw "error parsing obj";
						}
						int iv = indices[0];
						int ivt = indices[1];
						int ivn = indices[2];
						if (iv < 0) iv += v.size()+1;
						if (ivt < 0) ivt += vt.size()+1;
						if (ivn < 0) ivn += vn.size()+1;
						vv.push_back(v[iv-1]);
						vvt.push_back(ivt? vt[ivt-1]: vec2f());
						vvn.push_back(ivn? vn[ivn-1]: vec3f(0,1,0));
						recompute_normal |= !ivn;
					}
					if (vv.size() == 3) {
						// ignore triangles of zero surface area
						if (cross(vv[1]-vv[0],vv[2]-vv[0]) != vec3f(0)) {
							faces.push_back(new Triangle(vv[0], vv[1], vv[2], vvt[0], vvt[1], vvt[2], vvn[0], vvn[1], vvn[2]));
							if (recompute_normal)
								dynamic_cast<Triangle*>(faces.back())->recompute_normal();
						}
					}
					else {
						throw "mesh face other than triangle not supported";
					}
				} // end reading face
			}
		}
		return faces;
	}